

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bucketaccum.hpp
# Opt level: O2

void __thiscall
mp::BucketAccum1Type<mp::LinTerms>::~BucketAccum1Type(BucketAccum1Type<mp::LinTerms> *this)

{
  long lVar1;
  
  lVar1 = 0x1d88;
  do {
    LinTerms::~LinTerms((LinTerms *)
                        ((long)(this->buckets_)._M_elems[0].coefs_.
                               super_small_vector_base<std::allocator<double>,_6U>.m_data.m_storage.
                               m_data + lVar1 + -0x18));
    lVar1 = lVar1 + -0x78;
  } while (lVar1 != -0x78);
  return;
}

Assistant:

BucketAccum1Type<Body>::~BucketAccum1Type() {
#ifndef NDEBUG
  for (const auto& b: buckets_)
    assert(b.empty());
#endif
}